

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::RequiredExtensions::check
          (RequiredExtensions *this,ContextInfo *ctxInfo)

{
  int iVar1;
  pointer this_00;
  bool bVar2;
  size_type sVar3;
  const_reference ppcVar4;
  reference ppcVar5;
  NotSupportedError *this_01;
  string local_1e8;
  int local_1c4;
  ostringstream local_1c0 [4];
  int ndx_1;
  ostringstream buf;
  int local_34;
  undefined1 local_30 [4];
  int ndx;
  vector<const_char_*,_std::allocator<const_char_*>_> failedExtensions;
  ContextInfo *ctxInfo_local;
  RequiredExtensions *this_local;
  
  failedExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)ctxInfo;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  local_34 = 0;
  while( true ) {
    sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&this->m_extensions);
    this_00 = failedExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((int)sVar3 <= local_34) break;
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&this->m_extensions,(long)local_34);
    bVar2 = glu::ContextInfo::isExtensionSupported((ContextInfo *)this_00,*ppcVar4);
    if (!bVar2) {
      ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&this->m_extensions,(long)local_34);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,ppcVar4);
    }
    local_34 = local_34 + 1;
  }
  bVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    std::operator<<((ostream *)local_1c0,"Test requires extension: ");
    local_1c4 = 0;
    while( true ) {
      iVar1 = local_1c4;
      sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
      if ((int)sVar3 <= iVar1) break;
      if (local_1c4 != 0) {
        std::operator<<((ostream *)local_1c0,", ");
      }
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,
                           (long)local_1c4);
      std::operator<<((ostream *)local_1c0,*ppcVar5);
      local_1c4 = local_1c4 + 1;
    }
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::ostringstream::str();
    tcu::NotSupportedError::NotSupportedError(this_01,&local_1e8);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  return;
}

Assistant:

void RequiredExtensions::check (const glu::ContextInfo& ctxInfo) const
{
	std::vector<const char*> failedExtensions;

	for (int ndx = 0; ndx < (int)m_extensions.size(); ++ndx)
		if (!ctxInfo.isExtensionSupported(m_extensions[ndx]))
			failedExtensions.push_back(m_extensions[ndx]);

	if (!failedExtensions.empty())
	{
		std::ostringstream buf;
		buf << "Test requires extension: ";

		for (int ndx = 0; ndx < (int)failedExtensions.size(); ++ndx)
		{
			if (ndx)
				buf << ", ";
			buf << failedExtensions[ndx];
		}

		throw tcu::NotSupportedError(buf.str());
	}
}